

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.hpp
# Opt level: O3

bool __thiscall chaiscript::Type_Info::operator==(Type_Info *this,type_info *ti)

{
  char *__s1;
  int iVar1;
  
  if ((this->m_flags & 0x20) == 0) {
    __s1 = *(char **)(this->m_type_info + 8);
    if (__s1 == *(char **)(ti + 8)) {
      return true;
    }
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,*(char **)(ti + 8));
      return iVar1 == 0;
    }
  }
  return false;
}

Assistant:

constexpr bool is_undef() const noexcept { return (m_flags & (1 << is_undef_flag)) != 0; }